

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

string * __thiscall
testing::internal::String::FormatIntWidth2_abi_cxx11_
          (string *__return_storage_ptr__,String *this,int value)

{
  long lVar1;
  stringstream ss;
  stringstream local_1a0 [16];
  long local_190 [2];
  undefined8 auStack_180 [12];
  ios_base local_120 [112];
  char acStack_b0 [152];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  lVar1 = *(long *)(local_190[0] + -0x18);
  if (acStack_b0[lVar1 + 1] == '\0') {
    std::ios::widen((char)local_190 + (char)lVar1);
    acStack_b0[lVar1 + 1] = '\x01';
  }
  acStack_b0[lVar1] = '0';
  *(undefined8 *)((long)auStack_180 + *(long *)(local_190[0] + -0x18)) = 2;
  std::ostream::operator<<((ostream *)local_190,(int)this);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

std::string String::FormatIntWidth2(int value) {
  std::stringstream ss;
  ss << std::setfill('0') << std::setw(2) << value;
  return ss.str();
}